

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O2

int __thiscall QPainterState::init(QPainterState *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  totally_ordered_wrapper<QFontPrivate_*> tVar2;
  _Head_base<0UL,_QBrushData_*,_false> _Var3;
  LayoutDirection LVar4;
  long in_FS_OFFSET;
  QFont local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QBrush::operator=(&this->bgBrush,white);
  this->bgMode = TransparentMode;
  this->field_0x1a0 = this->field_0x1a0 & 0xf8 | 4;
  this->wx = 0;
  this->wy = 0;
  this->ww = 0;
  this->wh = 0;
  this->vx = 0;
  this->vy = 0;
  this->vw = 0;
  this->vh = 0;
  this->painter = (QPainter *)ctx;
  QPen::QPen((QPen *)&local_28);
  tVar2.ptr = (QFontPrivate *)(this->pen).d.d.ptr;
  (this->pen).d.d.ptr = (QPenPrivate *)local_28.d.d.ptr;
  local_28.d.d.ptr =
       (totally_ordered_wrapper<QFontPrivate_*>)(totally_ordered_wrapper<QFontPrivate_*>)tVar2.ptr;
  QPen::~QPen((QPen *)&local_28);
  (this->brushOrigin).xp = 0.0;
  (this->brushOrigin).yp = 0.0;
  QBrush::QBrush((QBrush *)&local_28);
  _Var3._M_head_impl =
       (this->brush).d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
  (this->brush).d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)local_28.d.d.ptr;
  local_28.d.d.ptr =
       (totally_ordered_wrapper<QFontPrivate_*>)
       (totally_ordered_wrapper<QFontPrivate_*>)_Var3._M_head_impl;
  QBrush::~QBrush((QBrush *)&local_28);
  QFont::QFont(&local_28);
  tVar2.ptr = (this->deviceFont).d.d.ptr;
  (this->deviceFont).d.d.ptr = (QFontPrivate *)local_28.d.d.ptr;
  uVar1 = (this->deviceFont).resolve_mask;
  (this->deviceFont).resolve_mask = local_28.resolve_mask;
  local_28.d.d.ptr =
       (totally_ordered_wrapper<QFontPrivate_*>)(totally_ordered_wrapper<QFontPrivate_*>)tVar2.ptr;
  local_28.resolve_mask = uVar1;
  QFont::operator=(&this->font,&this->deviceFont);
  QFont::~QFont(&local_28);
  QRegion::QRegion((QRegion *)&local_28);
  tVar2.ptr = (QFontPrivate *)(this->clipRegion).d;
  (this->clipRegion).d = (QRegionData *)local_28.d.d.ptr;
  local_28.d.d.ptr =
       (totally_ordered_wrapper<QFontPrivate_*>)(totally_ordered_wrapper<QFontPrivate_*>)tVar2.ptr;
  QRegion::~QRegion((QRegion *)&local_28);
  QPainterPath::QPainterPath((QPainterPath *)&local_28);
  tVar2.ptr = (QFontPrivate *)(this->clipPath).d_ptr.d.ptr;
  (this->clipPath).d_ptr.d.ptr = (QPainterPathPrivate *)local_28.d.d.ptr;
  local_28.d.d.ptr =
       (totally_ordered_wrapper<QFontPrivate_*>)(totally_ordered_wrapper<QFontPrivate_*>)tVar2.ptr;
  QPainterPath::~QPainterPath((QPainterPath *)&local_28);
  this->clipOperation = NoClip;
  QList<QPainterClipInfo>::clear(&this->clipInfo);
  QTransform::reset(&this->worldMatrix);
  QTransform::reset(&this->matrix);
  LVar4 = QGuiApplication::layoutDirection();
  this->layoutDirection = LVar4;
  this->composition_mode = CompositionMode_SourceOver;
  this->emulationSpecifier = 0;
  (this->super_QPaintEngineState).dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
  super_QFlagsStorage<QPaintEngine::DirtyFlag>.i = 0;
  this->changeFlags = 0;
  (this->renderHints).super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
  super_QFlagsStorage<QPainter::RenderHint>.i = 0;
  this->opacity = 1.0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QPainterState::init(QPainter *p) {
    bgBrush = Qt::white;
    bgMode = Qt::TransparentMode;
    WxF = false;
    VxF = false;
    clipEnabled = true;
    wx = wy = ww = wh = 0;
    vx = vy = vw = vh = 0;
    painter = p;
    pen = QPen();
    brushOrigin = QPointF(0, 0);
    brush = QBrush();
    font = deviceFont = QFont();
    clipRegion = QRegion();
    clipPath = QPainterPath();
    clipOperation = Qt::NoClip;
    clipInfo.clear();
    worldMatrix.reset();
    matrix.reset();
    layoutDirection = QGuiApplication::layoutDirection();
    composition_mode = QPainter::CompositionMode_SourceOver;
    emulationSpecifier = 0;
    dirtyFlags = { };
    changeFlags = 0;
    renderHints = { };
    opacity = 1;
}